

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O0

int fill_with_entropy(uint8_t *out,size_t len,int block,int seed)

{
  int *piVar1;
  bool bVar2;
  long local_38;
  ssize_t r;
  int getrandom_flags;
  int seed_local;
  int block_local;
  size_t len_local;
  uint8_t *out_local;
  
  if (len != 0) {
    r._4_4_ = (uint)(block == 0);
    if (seed != 0) {
      r._4_4_ = extra_getrandom_flags_for_seed | r._4_4_;
    }
    CRYPTO_init_sysrand();
    if (block != 0) {
      CRYPTO_once(&wait_for_entropy_once,wait_for_entropy);
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    len_local = (size_t)out;
    for (_seed_local = len; _seed_local != 0; _seed_local = _seed_local - local_38) {
      if (urandom_fd == -3) {
        local_38 = boringssl_getrandom((void *)len_local,_seed_local,r._4_4_);
      }
      else {
        do {
          local_38 = read(urandom_fd,(void *)len_local,_seed_local);
          bVar2 = false;
          if (local_38 == -1) {
            piVar1 = __errno_location();
            bVar2 = *piVar1 == 4;
          }
        } while (bVar2);
      }
      if (local_38 < 1) {
        return 0;
      }
      len_local = local_38 + len_local;
    }
  }
  return 1;
}

Assistant:

static int fill_with_entropy(uint8_t *out, size_t len, int block, int seed) {
  if (len == 0) {
    return 1;
  }

#if defined(USE_NR_getrandom) || defined(FREEBSD_GETRANDOM)
  int getrandom_flags = 0;
  if (!block) {
    getrandom_flags |= GRND_NONBLOCK;
  }
#endif

#if defined(USE_NR_getrandom)
  if (seed) {
    getrandom_flags |= extra_getrandom_flags_for_seed;
  }
#endif

  CRYPTO_init_sysrand();
  if (block) {
    CRYPTO_once(&wait_for_entropy_once, wait_for_entropy);
  }

  // Clear |errno| so it has defined value if |read| or |getrandom|
  // "successfully" returns zero.
  errno = 0;
  while (len > 0) {
    ssize_t r;

    if (urandom_fd == kHaveGetrandom) {
#if defined(USE_NR_getrandom)
      r = boringssl_getrandom(out, len, getrandom_flags);
#else  // USE_NR_getrandom
      fprintf(stderr, "urandom fd corrupt.\n");
      abort();
#endif
    } else {
      do {
        r = read(urandom_fd, out, len);
      } while (r == -1 && errno == EINTR);
    }

    if (r <= 0) {
      return 0;
    }
    out += r;
    len -= r;
  }

  return 1;
}